

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_url.c
# Opt level: O1

char find_delim(char **pp,int colon_and_at_sign_are_delims)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  byte unaff_BPL;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  int chars;
  uint val;
  undefined8 local_38;
  
  pbVar5 = (byte *)*pp;
  pbVar6 = pbVar5;
  local_38 = in_RAX;
  do {
    pbVar7 = pbVar6 + 1;
    bVar1 = *pbVar6;
    uVar4 = (ulong)(bVar1 - 0x23);
    if (bVar1 - 0x23 < 0x3b) {
      if ((0x500000010001001U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x20800000UL >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 != 2) goto LAB_0010c9e7;
          iVar3 = __isoc99_sscanf(pbVar7,"%2x%n",(long)&local_38 + 4,&local_38);
          bVar2 = (int)local_38 == 2 && 0 < iVar3;
          if ((int)local_38 == 2 && 0 < iVar3) {
            *pbVar5 = local_38._4_1_;
            pbVar5 = pbVar5 + 1;
            pbVar7 = pbVar6 + 3;
          }
          else {
            unaff_BPL = 0x25;
          }
          goto LAB_0010c98c;
        }
        if (colon_and_at_sign_are_delims == 0) goto LAB_0010c9eb;
      }
LAB_0010c980:
      *pbVar5 = 0;
      *pp = (char *)pbVar7;
      bVar2 = false;
      unaff_BPL = bVar1;
    }
    else {
LAB_0010c9e7:
      if (bVar1 == 0) goto LAB_0010c980;
LAB_0010c9eb:
      *pbVar5 = bVar1;
      pbVar5 = pbVar5 + 1;
      bVar2 = true;
    }
LAB_0010c98c:
    pbVar6 = pbVar7;
    if (!bVar2) {
      return unaff_BPL;
    }
  } while( true );
}

Assistant:

static char find_delim(char **pp, int colon_and_at_sign_are_delims)
{
  char *from = *pp;
  char *to = from;

  for (;;) {
    char ch = *from++;

    switch (ch) {
    case ':':
    case '@':
      if (!colon_and_at_sign_are_delims) {
        *to++ = ch;
        break;
      }

      /* fall through */
    case 0:
    case '/':
    case '?':
    case '#':
    case '[':
    case ']':
      *to = 0;
      *pp = from;
      return ch;

    case '%': {
      unsigned int val;
      int chars;
      int res = sscanf(from, "%2x%n", &val, &chars);

      if (res == EOF || res < 1 || chars != 2)
        /* Return a surprising delimiter to
           force an error. */
      {
        return '%';
      }

      *to++ = val;
      from += 2;
      break;
    }

    default:
      *to++ = ch;
      break;
    }
  }
}